

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMain.h
# Opt level: O2

void __thiscall MinVR::VRParseCommandLine::noParsing(VRParseCommandLine *this)

{
  std::__cxx11::string::assign((char *)&this->_setConfigValueShort);
  std::__cxx11::string::assign((char *)&this->_setConfigValueLong);
  std::__cxx11::string::assign((char *)&this->_loadConfigShort);
  std::__cxx11::string::assign((char *)&this->_loadConfigLong);
  std::__cxx11::string::assign((char *)&this->_helpShort);
  std::__cxx11::string::assign((char *)&this->_helpLong);
  std::__cxx11::string::assign((char *)&this->_noExecute);
  return;
}

Assistant:

void noParsing() {
    _setConfigValueShort = "";
    _setConfigValueLong = "";
    _loadConfigShort = "";
    _loadConfigLong = "";
    _helpShort = "";
    _helpLong = "";
    _noExecute = "";
  }